

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O0

void __thiscall glslang::TIntermAggregate::TIntermAggregate(TIntermAggregate *this)

{
  EVP_PKEY_CTX *ctx;
  TIntermAggregate *this_local;
  
  ctx = (EVP_PKEY_CTX *)0x0;
  TIntermOperator::TIntermOperator(&this->super_TIntermOperator,EOpNull);
  (this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode =
       (_func_int **)&PTR_getLoc_010df540;
  TVector<TIntermNode_*>::TVector(&this->sequence);
  TVector<glslang::TStorageQualifier>::TVector(&this->qualifier);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&this->name);
  this->userDefined = false;
  this->pragmaTable = (TPragmaTable *)0x0;
  TSpirvInstruction::TSpirvInstruction(&this->spirvInst);
  this->linkType = ELinkNone;
  TSourceLoc::init(&this->endLoc,ctx);
  return;
}

Assistant:

TIntermAggregate() : TIntermOperator(EOpNull), userDefined(false), pragmaTable(nullptr) { 
        endLoc.init();
    }